

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intraprocess_subscriber_link.cpp
# Opt level: O2

void __thiscall
miniros::IntraProcessSubscriberLink::enqueueMessage
          (IntraProcessSubscriberLink *this,SerializedMessage *m,bool ser,bool nocopy)

{
  element_type *peVar1;
  
  std::recursive_mutex::lock(&this->drop_mutex_);
  if (this->dropped_ == false) {
    peVar1 = (this->subscriber_).
             super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*(peVar1->super_PublisherLink)._vptr_PublisherLink[2])(peVar1,m,(ulong)ser,(ulong)nocopy);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->drop_mutex_);
  return;
}

Assistant:

void IntraProcessSubscriberLink::enqueueMessage(const SerializedMessage& m, bool ser, bool nocopy)
{
  std::scoped_lock<std::recursive_mutex> lock(drop_mutex_);
  if (dropped_)
  {
    return;
  }

  MINIROS_ASSERT(subscriber_);
  subscriber_->handleMessage(m, ser, nocopy);
}